

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

string * __thiscall
helics::CoreBroker::quickBrokerQueries_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view request)

{
  long lVar1;
  value_t vVar2;
  BrokerState BVar3;
  pointer pcVar4;
  json_value jVar5;
  undefined8 uVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  string *psVar9;
  reference pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t __n;
  char *pcVar13;
  char *pcVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  string_view fmt;
  format_args args;
  json base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  data local_68;
  data local_50;
  data local_40;
  
  pcVar13 = request._M_str;
  __n = request._M_len;
  lVar1 = __n - 4;
  switch(lVar1) {
  case 0:
switchD_002f1183_caseD_0:
    iVar7 = bcmp(pcVar13,"name",__n);
    if (iVar7 == 0) goto LAB_002f14cc;
    if ((long)__n < 10) {
      if (__n == 6) goto switchD_002f121a_caseD_2;
LAB_002f12ac:
      if (__n != 7) goto switchD_002f1183_caseD_1;
      goto switchD_002f1183_caseD_3;
    }
    if (__n != 0x11) {
      if (__n != 10) goto switchD_002f1183_caseD_1;
      goto switchD_002f1183_caseD_6;
    }
    break;
  default:
    goto switchD_002f1183_caseD_1;
  case 2:
    iVar7 = bcmp(pcVar13,"isinit",__n);
    if (iVar7 != 0) {
      switch(lVar1) {
      case 0:
        goto switchD_002f1183_caseD_0;
      default:
        goto switchD_002f1183_caseD_1;
      case 2:
        goto switchD_002f121a_caseD_2;
      case 3:
        goto switchD_002f1183_caseD_3;
      case 6:
        goto switchD_002f1183_caseD_6;
      case 7:
        goto switchD_002f1183_caseD_7;
      case 0xd:
        goto switchD_002f1183_caseD_d;
      }
    }
    BVar3 = (this->super_BrokerBase).brokerState._M_i;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (BVar3 < OPERATING) goto LAB_002f1550;
    goto LAB_002f176b;
  case 3:
switchD_002f1183_caseD_3:
    iVar7 = bcmp(pcVar13,"queries",__n);
    if (iVar7 == 0) goto LAB_002f13b3;
    if (__n != 6) {
      if (__n != 7) goto switchD_002f121a_default;
      goto LAB_002f1314;
    }
    goto LAB_002f1380;
  case 6:
switchD_002f1183_caseD_6:
    iVar7 = bcmp(pcVar13,"identifier",__n);
    if (iVar7 == 0) {
LAB_002f14cc:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
      pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_90,(this->super_BrokerBase).identifier._M_dataplus._M_p,
                            (this->super_BrokerBase).identifier._M_string_length);
      local_b8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar12 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar12) {
        local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_replace_aux(&local_b8,local_b8._M_string_length,0,1,'\"');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (pbVar11->_M_dataplus)._M_p;
      paVar12 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar12) {
        uVar6 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_002f1754;
    }
    if (__n != 0x11) {
      if (__n != 7) {
        if (__n != 6) goto switchD_002f1183_caseD_1;
        goto switchD_002f121a_caseD_2;
      }
      goto switchD_002f1183_caseD_3;
    }
    break;
  case 7:
switchD_002f1183_caseD_7:
    iVar7 = bcmp(pcVar13,"isconnected",__n);
    if (iVar7 == 0) {
      BVar3 = (this->super_BrokerBase).brokerState._M_i;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (6 < (ushort)(BVar3 + CONNECTED_ERROR)) {
LAB_002f1550:
        pcVar14 = "false";
        pcVar13 = "";
        goto LAB_002f1779;
      }
LAB_002f176b:
      pcVar14 = "true";
      pcVar13 = "";
LAB_002f1779:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar14,pcVar13);
      return __return_storage_ptr__;
    }
    switch(lVar1) {
    case 0:
      goto switchD_002f1183_caseD_0;
    case 1:
    case 4:
    case 5:
      goto switchD_002f1183_caseD_1;
    case 2:
switchD_002f121a_caseD_2:
      iVar7 = bcmp(pcVar13,"exists",__n);
      if (iVar7 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        goto LAB_002f176b;
      }
      if (__n != 6) {
        if (__n != 0x11) goto LAB_002f12ac;
        break;
      }
      goto LAB_002f1380;
    case 3:
      goto switchD_002f1183_caseD_3;
    case 6:
      goto switchD_002f1183_caseD_6;
    default:
switchD_002f121a_default:
      if (__n != 0x11) goto switchD_002f1183_caseD_1;
    }
    break;
  case 0xd:
    break;
  }
switchD_002f1183_caseD_d:
  iVar7 = bcmp(pcVar13,"available_queries",__n);
  if (iVar7 == 0) {
LAB_002f13b3:
    local_70 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
    __return_storage_ptr__->_M_string_length = 1;
    if (querySet_abi_cxx11_._24_8_ != 0x4fbe70) {
      p_Var8 = (_Rb_tree_node_base *)querySet_abi_cxx11_._24_8_;
      do {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,&local_90);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump(&local_b8,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,-1,' ',true,hex);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_40);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,',');
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)(querySet_abi_cxx11_ + 8));
    }
    if (1 < __return_storage_ptr__->_M_string_length) {
      (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] = ']'
      ;
      return __return_storage_ptr__;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
    return __return_storage_ptr__;
  }
  if (__n != 6) {
    if (__n != 7) goto switchD_002f1183_caseD_1;
LAB_002f1314:
    iVar7 = bcmp(pcVar13,"address",__n);
    if (iVar7 == 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
      psVar9 = getAddress_abi_cxx11_(this);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     psVar9);
      std::operator+(__return_storage_ptr__,&local_b8,'\"');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_002f173d:
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (__n == 6) goto LAB_002f1380;
      if (__n != 7) goto switchD_002f1183_caseD_1;
      iVar7 = bcmp(pcVar13,"version",7);
      if (iVar7 != 0) {
        iVar7 = bcmp(pcVar13,"counter",7);
        if (iVar7 == 0) {
          local_b8._M_dataplus._M_p._0_4_ = generateMapObjectCounter(this);
          fmt.size_ = 1;
          fmt.data_ = (char *)0x2;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&local_b8;
          ::fmt::v11::vformat_abi_cxx11_((string *)__return_storage_ptr__,(v11 *)0x3e615e,fmt,args);
          return __return_storage_ptr__;
        }
        goto switchD_002f1183_caseD_1;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
      pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90,"3.6.1 (2025-02-24)");
      local_b8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar12 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar12) {
        local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      std::operator+(__return_storage_ptr__,&local_b8,'\"');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_002f173d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
LAB_002f1754:
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
LAB_002f1380:
  iVar7 = bcmp(pcVar13,"status",__n);
  if (iVar7 == 0) {
    local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffffffffff00;
    local_b8._M_string_length = 0;
    BrokerBase::addBaseInformation
              (&this->super_BrokerBase,(json *)&local_b8,
               (bool)((this->super_BrokerBase).field_0x294 ^ 1));
    psVar9 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_b8,"state");
    vVar2 = (pvVar10->m_data).m_type;
    (pvVar10->m_data).m_type = local_50.m_type;
    jVar5 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value = local_50.m_value;
    local_50.m_type = vVar2;
    local_50.m_value = jVar5;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_50);
    local_68.m_type = null;
    local_68._1_7_ = 0;
    local_68.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_68,
               (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7);
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_b8,"status");
    vVar2 = (pvVar10->m_data).m_type;
    (pvVar10->m_data).m_type = local_68.m_type;
    local_68.m_type = vVar2;
    jVar5 = (pvVar10->m_data).m_value;
    (pvVar10->m_data).m_value.object = (object_t *)local_68.m_value;
    local_68.m_value = jVar5;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_68);
    fileops::generateJsonString((string *)__return_storage_ptr__,(json *)&local_b8,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_b8);
    return __return_storage_ptr__;
  }
switchD_002f1183_caseD_1:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::quickBrokerQueries(std::string_view request) const
{
    if (request == "isinit") {
        return (getBrokerState() >= BrokerState::OPERATING) ? std::string("true") :
                                                              std::string("false");
    }
    if (request == "isconnected") {
        return (isConnected()) ? std::string("true") : std::string("false");
    }
    if (request == "name" || request == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (request == "exists") {
        return "true";
    }
    if ((request == "queries") || (request == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (request == "address") {
        return std::string{"\""} + getAddress() + '"';
    }
    if (request == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (request == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (request == "status") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        return fileops::generateJsonString(base);
    }
    return {};
}